

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O2

ref<immutable::rrb_details::internal_node<int,_true>_> *
immutable::rrb_details::mutate_first_k<int,true,5>
          (ref<immutable::transient_rrb<int,_true,_5>_> *trrb,uint32_t k)

{
  guid_type guid;
  uint32_t uVar1;
  uint32_t *puVar2;
  ref<immutable::rrb_details::internal_node<int,_true>_> *prVar3;
  transient_rrb<int,_true,_5> *ptVar4;
  internal_node<int,_true> *piVar5;
  internal_node<int,_true> *piVar6;
  rrb_size_table<true> *prVar7;
  leaf_node<int,_true> *plVar8;
  uint uVar9;
  uint uVar10;
  ref<immutable::rrb_details::internal_node<int,true>> *this;
  uint32_t uVar11;
  ref<immutable::rrb_details::internal_node<int,_true>_> temp;
  uint local_40;
  ref<immutable::rrb_details::internal_node<int,_true>_> current;
  
  ptVar4 = ref<immutable::transient_rrb<int,_true,_5>_>::operator->(trrb);
  guid = ptVar4->guid;
  ptVar4 = ref<immutable::transient_rrb<int,_true,_5>_>::operator->(trrb);
  current.ptr = (internal_node<int,_true> *)(ptVar4->root).ptr;
  if (current.ptr != (internal_node<int,_true> *)0x0) {
    LOCK();
    ((current.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
         ((current.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  ptVar4 = ref<immutable::transient_rrb<int,_true,_5>_>::operator->(trrb);
  this = (ref<immutable::rrb_details::internal_node<int,true>> *)&ptVar4->root;
  ptVar4 = ref<immutable::transient_rrb<int,_true,_5>_>::operator->(trrb);
  local_40 = ptVar4->cnt - 2;
  ptVar4 = ref<immutable::transient_rrb<int,_true,_5>_>::operator->(trrb);
  uVar9 = 1;
  for (uVar11 = ptVar4->shift; (uVar9 <= k && (uVar11 != 0)); uVar11 = uVar11 - 5) {
    ensure_internal_editable<int,true,5>(&current,guid);
    ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
              ((ref<immutable::rrb_details::internal_node<int,_true>_> *)this,&current);
    if (k == uVar9) {
      piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
      piVar5->len = piVar5->len + 1;
    }
    piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
    if ((piVar5->size_table).ptr != (rrb_size_table<true> *)0x0) {
      piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
      piVar6 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
      ensure_size_table_editable<int,true,5>(&piVar5->size_table,piVar6->len,guid);
      piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
      prVar7 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&piVar5->size_table);
      puVar2 = prVar7->size;
      piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
      if (k == uVar9) {
        uVar1 = puVar2[piVar5->len - 2];
        piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
        prVar7 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&piVar5->size_table)
        ;
        puVar2 = prVar7->size;
        piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
        puVar2[piVar5->len - 1] = uVar1 + 0x20;
      }
      else {
        puVar2 = puVar2 + (piVar5->len - 1);
        *puVar2 = *puVar2 + 0x20;
      }
    }
    piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
    if ((piVar5->size_table).ptr == (rrb_size_table<true> *)0x0) {
      uVar10 = local_40 >> ((byte)uVar11 & 0x1f) & 0x1f;
    }
    else {
      piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
      uVar1 = piVar5->len;
      uVar10 = uVar1 - 1;
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
        prVar7 = ref<immutable::rrb_details::rrb_size_table<true>_>::operator->(&piVar5->size_table)
        ;
        local_40 = local_40 - prVar7->size[uVar1 - 2];
      }
    }
    piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
    prVar3 = piVar5->child;
    piVar5 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&current);
    temp.ptr = piVar5->child[uVar10].ptr;
    if (temp.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((temp.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((temp.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(&current,&temp);
    this = (ref<immutable::rrb_details::internal_node<int,true>> *)(prVar3 + uVar10);
    uVar9 = uVar9 + 1;
    ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&temp);
  }
  if (k == uVar9) {
    temp = current;
    if (current.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((current.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((current.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    ensure_leaf_editable<int,true,5>
              ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)&temp,guid);
    plVar8 = ref<immutable::rrb_details::leaf_node<int,_true>_>::operator->
                       ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)&temp);
    plVar8->len = plVar8->len + 1;
    ref<immutable::rrb_details::internal_node<int,true>>::operator=
              (this,(ref<immutable::rrb_details::leaf_node<int,_true>_> *)&temp);
    release<int>((leaf_node<int,_true> *)temp.ptr);
  }
  ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&current);
  return (ref<immutable::rrb_details::internal_node<int,_true>_> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* mutate_first_k(const ref<transient_rrb<T, atomic_ref_counting, N>>& trrb, const uint32_t k)
      {
      guid_type guid = trrb->guid;
      ref<internal_node<T, atomic_ref_counting>> current = trrb->root;
      ref<internal_node<T, atomic_ref_counting>>* to_set = (ref<internal_node<T, atomic_ref_counting>>*)&trrb->root;
      uint32_t index = trrb->cnt - 2;
      uint32_t shift = trrb->shift;

      // mutate all non-leaf nodes first. Happens when shift > RRB_BRANCHING
      uint32_t i = 1;
      while (i <= k && shift != 0)
        {
        // First off, ensure current node is editable
        ensure_internal_editable<T, atomic_ref_counting, N>(current, guid);
        *to_set = current;

        if (i == k)
          {
          // increase width of node
          current->len++;
          }

        if (current->size_table.ptr != nullptr)
          {
          // Ensure size table is editable too
          ensure_size_table_editable<T, atomic_ref_counting, N>(current->size_table, current->len, guid);
          if (i != k)
            {
            // Tail will always be 32 long, otherwise we insert a single element only
            current->size_table->size[current->len - 1] += bits<N>::rrb_branching;
            }
          else { // increment size of last element -- will only happen if we append empties
            current->size_table->size[current->len - 1] = current->size_table->size[current->len - 2] + bits<N>::rrb_branching;
            }
          }

        // calculate child index
        uint32_t child_index;
        if (current->size_table.ptr == nullptr)
          {
          child_index = (index >> shift) & bits<N>::rrb_mask;
          }
        else {
          // no need for sized_pos here, luckily.
          child_index = current->len - 1;
          // Decrement index
          if (child_index != 0)
            {
            index -= current->size_table->size[child_index - 1];
            }
          }
        to_set = &current->child[child_index];
        auto temp = current->child[child_index];
        current = temp;

        i++;
        shift -= bits<N>::rrb_bits;
        }

      // check if we need to mutate the leaf node. Very likely to happen (31/32)
      if (i == k)
        {
        ref<leaf_node<T, atomic_ref_counting>> leaf = current;
        ensure_leaf_editable<T, atomic_ref_counting, N>(leaf, guid);
        leaf->len++;
        *to_set = leaf;
        }
      return to_set;
      }